

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ORForest.cpp
# Opt level: O1

void __thiscall
RandomForest::ORForest<float>::GetRankedGiniImportance
          (ORForest<float> *this,
          shared_ptr<std::vector<int,_std::allocator<int>_>_> *o_featureIndexList,
          shared_ptr<std::vector<double,_std::allocator<double>_>_> *o_giniImportanceList)

{
  double dVar1;
  int iVar2;
  int iVar3;
  vector<int,_std::allocator<int>_> *this_00;
  element_type *peVar4;
  pointer psVar5;
  element_type *peVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  pointer this_01;
  ulong uVar17;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> featureIndexList;
  shared_ptr<std::vector<double,_std::allocator<double>_>_> giniImportanceList;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  vector<double,_std::allocator<double>_> *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  double local_48;
  long *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  this_00 = (o_featureIndexList->
            super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  local_60._M_pi =
       (o_featureIndexList->
       super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
    }
  }
  local_58 = (o_giniImportanceList->
             super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
  local_50._M_pi =
       (o_giniImportanceList->
       super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>)
       ._M_refcount._M_pi;
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
    }
  }
  peVar4 = (this->trainData).
           super___shared_ptr<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  psVar5 = (peVar4->
           super__Vector_base<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((peVar4->
      super__Vector_base<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != psVar5) {
    peVar6 = (psVar5->
             super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    std::vector<int,_std::allocator<int>_>::resize
              (this_00,((long)*(pointer *)
                               ((long)&(peVar6->super__Vector_base<float,_std::allocator<float>_>).
                                       _M_impl.super__Vector_impl_data + 8) -
                        *(long *)&(peVar6->super__Vector_base<float,_std::allocator<float>_>).
                                  _M_impl.super__Vector_impl_data >> 2) - 1);
    peVar4 = (this->trainData).
             super___shared_ptr<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    psVar5 = (peVar4->
             super__Vector_base<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((peVar4->
        super__Vector_base<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != psVar5) {
      peVar6 = (psVar5->
               super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      std::vector<double,_std::allocator<double>_>::resize
                (local_58,((long)*(pointer *)
                                  ((long)&(peVar6->super__Vector_base<float,_std::allocator<float>_>
                                          )._M_impl.super__Vector_impl_data + 8) -
                           *(long *)&(peVar6->super__Vector_base<float,_std::allocator<float>_>).
                                     _M_impl.super__Vector_impl_data >> 2) - 1);
      piVar7 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = (long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar7;
      if (lVar10 != 0) {
        lVar10 = lVar10 >> 2;
        pdVar8 = (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar9 = (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        lVar13 = 0;
        do {
          piVar7[lVar13] = (int)lVar13;
          if ((long)pdVar9 - (long)pdVar8 >> 3 == lVar13) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          pdVar8[lVar13] = 0.0;
          lVar13 = lVar13 + 1;
        } while (lVar10 + (ulong)(lVar10 == 0) != lVar13);
      }
      this_01 = (this->trees).
                super__Vector_base<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (this_01 !=
          (this->trees).
          super__Vector_base<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          ODTree<float>::UpdateGiniImportance(this_01);
          if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish !=
              (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start) {
            uVar12 = 0;
            do {
              pdVar8 = (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(local_58->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)pdVar8 >> 3) <=
                  uVar12) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar12);
              }
              local_48 = pdVar8[uVar12];
              ODTree<float>::GetGiniImportance(this_01);
              if (((ulong)(local_40[1] - *local_40 >> 3) <= uVar12) ||
                 (pdVar8 = (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start,
                 (ulong)((long)(local_58->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)pdVar8 >> 3) <=
                 uVar12)) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar12);
              }
              pdVar8[uVar12] = local_48 + *(double *)(*local_40 + uVar12 * 8);
              if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 < (ulong)((long)(this_00->super__Vector_base<int,_std::allocator<int>_>)
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this_00->super__Vector_base<int,_std::allocator<int>_>)
                                            ._M_impl.super__Vector_impl_data._M_start >> 2));
          }
          this_01 = this_01 + 1;
        } while (this_01 !=
                 (this->trees).
                 super__Vector_base<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      piVar7 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = (long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar7 >> 2;
      if (uVar12 != 1) {
        uVar14 = 1;
        uVar15 = 0;
        do {
          uVar16 = uVar15 + 1;
          if (uVar16 < uVar12) {
            pdVar8 = (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar11 = (long)(local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
            uVar17 = uVar14;
            if (uVar11 <= uVar15) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            do {
              if (uVar11 <= uVar17) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar11);
              }
              dVar1 = pdVar8[uVar15];
              if (dVar1 < pdVar8[uVar17]) {
                iVar2 = piVar7[uVar15];
                iVar3 = piVar7[uVar17];
                pdVar8[uVar15] = pdVar8[uVar17];
                pdVar8[uVar17] = dVar1;
                piVar7[uVar15] = iVar3;
                piVar7[uVar17] = iVar2;
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 < uVar12);
          }
          uVar14 = uVar14 + 1;
          uVar15 = uVar16;
        } while (uVar16 != uVar12 - 1);
      }
      (o_featureIndexList->
      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           = this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(o_featureIndexList->
                  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount,&local_60);
      (o_giniImportanceList->
      super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = local_58;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(o_giniImportanceList->
                  super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount,&local_50);
      if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
      }
      if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
      }
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
}

Assistant:

void RandomForest::ORForest<T>::GetRankedGiniImportance( std::shared_ptr<std::vector<int> > * o_featureIndexList,  std::shared_ptr<std::vector<double> > * o_giniImportanceList)
{
    std::shared_ptr<std::vector<int> > featureIndexList=* o_featureIndexList;
    std::shared_ptr<std::vector<double> > giniImportanceList=* o_giniImportanceList;
    featureIndexList->resize(trainData->at(0)->size()-1);
    giniImportanceList->resize(trainData->at(0)->size()-1);
    for(int i=0;i<featureIndexList->size();i++)
    {
        featureIndexList->at(i)=i;
        giniImportanceList->at(i)=0.0;
    }
    for (TreeListIterator tree_iter = trees.begin(); tree_iter != trees.end(); tree_iter++)
    {
        tree_iter->UpdateGiniImportance();
        for(int j=0;j<featureIndexList->size();j++)
        {
            giniImportanceList->at(j) = giniImportanceList->at(j) + tree_iter->GetGiniImportance()->at(j);
        }
    }
    
    // sorting
    for(int i=0;i<featureIndexList->size()-1;i++)
    {
        for(int j=i+1;j<featureIndexList->size();j++)
        {
            double leftValue=giniImportanceList->at(i);
            double rightValue=giniImportanceList->at(j);
            if(leftValue<rightValue)
            {
                int leftIndex=featureIndexList->at(i);
                int rightIndex=featureIndexList->at(j);
                giniImportanceList->at(i)=rightValue;
                giniImportanceList->at(j)=leftValue;
                featureIndexList->at(i)=rightIndex;
                featureIndexList->at(j)=leftIndex;
            }
        }
    }
    
    *o_featureIndexList=featureIndexList;
    *o_giniImportanceList=giniImportanceList;
}